

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
DeleteProperty_Internal<true>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,
          PropertyOperationFlags propertyOperationFlags)

{
  ScriptContext *scriptContext;
  RecyclerWeakReference<Js::DynamicObject> *pRVar1;
  code *pcVar2;
  _func_int **pp_Var3;
  uint uVar4;
  PropertyOperationFlags PVar5;
  bool bVar6;
  uint32 index;
  BOOL BVar7;
  undefined4 *puVar8;
  RecyclableObject *pRVar9;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this_00;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *pSVar10;
  Type *pTVar11;
  byte bVar12;
  ScriptContext *this_01;
  int local_54;
  RecyclableObject *pRStack_50;
  int i;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  undefined4 *local_38;
  
  bVar12 = (this->super_DynamicTypeHandler).flags;
  while ((bVar12 & 4) != 0) {
    this = ConvertToNonSharedSimpleDictionaryType(this,instance);
    bVar12 = (this->super_DynamicTypeHandler).flags;
  }
  if ((DAT_015bf33c == '\x01') && ((this->field_0x28 & 6) == 0)) {
    pSVar10 = &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
               ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::JavascriptString*,false>
                         ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                           *)this,instance)->
               super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>;
    BVar7 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
            DeleteProperty_Internal<false>(pSVar10,instance,propertyId,propertyOperationFlags);
    return BVar7;
  }
  local_38 = (undefined4 *)CONCAT44(local_38._4_4_,propertyOperationFlags);
  pTVar11 = (instance->super_RecyclableObject).type.ptr;
  if (*(char *)&pTVar11[1].javascriptLibrary.ptr == '\x01') {
    if (((bVar12 & 0x10) != 0) || (*(char *)((long)&pTVar11[1].javascriptLibrary.ptr + 1) == '\x01')
       ) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x6ab,
                                  "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())",
                                  "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()");
      if (!bVar6) goto LAB_00dee844;
      *puVar8 = 0;
    }
    DynamicObject::ChangeType(instance);
    pTVar11 = (instance->super_RecyclableObject).type.ptr;
  }
  scriptContext =
       (((pTVar11->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  this_01 = scriptContext;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x6b3,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar6) goto LAB_00dee844;
    *puVar8 = 0;
    this_01 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
  }
  local_48 = ScriptContext::GetPropertyName(this_01,propertyId);
  bVar6 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_48,
                     (SimpleDictionaryPropertyDescriptor<unsigned_short> **)&propertyRecord,
                     &local_54);
  uVar4 = DAT_015bf338;
  if (bVar6) {
    pp_Var3 = (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject;
    BVar7 = 1;
    if (((ulong)pp_Var3 & 0x800) == 0) {
      if (((ulong)pp_Var3 & 0x1200) == 0x200) {
        if (*(short *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject
                              ._vptr_IRecyclerVisitedObject + 2) != -1) {
          pRStack_50 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                       super_JavascriptLibraryBase).undefinedValue.ptr;
          if ((0 < (int)DAT_015bf338 && (this->field_0x28 & 2) == 0) &&
             (bVar12 = this->numDeletedProperties + 1, this->numDeletedProperties = bVar12,
             uVar4 <= bVar12)) {
            if (((this->field_0x28 & 4) == 0) &&
               (pRVar9 = ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties
                                   (&instance->super_RecyclableObject,(RecyclableObject **)0x0),
               pRVar9 == (RecyclableObject *)0x0)) {
              bVar6 = Phases::IsEnabled((Phases *)&DAT_015bc490,TypeHandlerTransitionPhase);
              PVar5 = (PropertyOperationFlags)local_38;
              if (bVar6) {
                Output::Print(
                             L"Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n"
                             );
                Output::Flush();
              }
              pSVar10 = &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                         ::
                         ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::JavascriptString*,false>
                                   ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                                     *)this,instance)->
                         super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
              ;
              BVar7 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                      ::DeleteProperty_Internal<false>(pSVar10,instance,propertyId,PVar5);
              return BVar7;
            }
            bVar6 = Phases::IsEnabled((Phases *)&DAT_015bc490,TypeHandlerTransitionPhase);
            PVar5 = (PropertyOperationFlags)local_38;
            if (bVar6) {
              Output::Print(
                           L"Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"
                           );
              Output::Flush();
            }
            this_00 = &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                       ::
                       ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::PropertyRecord_const*,false>
                                 ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                                   *)this,instance)->
                       super_SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>
            ;
            BVar7 = DeleteProperty_Internal<false>(this_00,instance,propertyId,PVar5);
            return BVar7;
          }
          pRVar1 = (this->singletonInstance).ptr;
          if ((pRVar1 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
             ((DynamicObject *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef != instance)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            local_38 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *local_38 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                        ,0x6f4,
                                        "(this->singletonInstance == nullptr || instance == this->singletonInstance->Get())"
                                        ,
                                        "this->singletonInstance == nullptr || instance == this->singletonInstance->Get()"
                                       );
            if (!bVar6) {
LAB_00dee844:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *local_38 = 0;
          }
          SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
          InvalidateFixedField<Js::PropertyRecord_const*>
                    ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                      *)this,local_48,
                     (SimpleDictionaryPropertyDescriptor<unsigned_short> *)propertyRecord,
                     (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr);
          if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
            ScriptContext::InvalidateProtoCaches(scriptContext,propertyId);
          }
          if (((this->field_0x28 & 2) == 0) ||
             (bVar6 = SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_false>
                      ::TryRegisterDeletedPropertyIndex
                                ((SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_false>
                                  *)this,instance,
                                 *(unsigned_short *)
                                  ((long)&(propertyRecord->super_FinalizableObject).
                                          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                                  + 2)), !bVar6)) {
            DynamicTypeHandler::SetSlotUnchecked
                      (instance,(uint)*(ushort *)
                                       ((long)&(propertyRecord->super_FinalizableObject).
                                               super_IRecyclerVisitedObject.
                                               _vptr_IRecyclerVisitedObject + 2),pRStack_50);
          }
        }
        *(undefined1 *)
         ((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject + 1) = 0xe;
        if ((char)((instance->super_RecyclableObject).type.ptr)->flags < '\0') {
          DynamicObject::ChangeType(instance);
        }
        DynamicTypeHandler::SetPropertyUpdateSideEffect
                  (&this->super_DynamicTypeHandler,instance,propertyId,(Var)0x0,SideEffects_Any);
      }
      else {
        JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
                  ((PropertyOperationFlags)local_38,scriptContext,(PCWSTR)(local_48 + 1));
        BVar7 = 0;
      }
    }
  }
  else {
    bVar6 = DynamicObject::HasObjectArray(instance);
    if ((bVar6) && (local_48->isNumeric == true)) {
      index = PropertyRecord::GetNumericValue(local_48);
      BVar7 = DynamicTypeHandler::DeleteItem
                        (&this->super_DynamicTypeHandler,instance,index,
                         (PropertyOperationFlags)local_38);
    }
    else {
      BVar7 = 1;
    }
  }
  return BVar7;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteProperty_Internal(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        if(!GetIsLocked())
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
                !TMapKey_IsJavascriptString<TMapKey>() &&
                !isUnordered && !hasNamelessPropertyId)
            {
                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
            }
#endif

            if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            ScriptContext* scriptContext = instance->GetScriptContext();
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            Assert(propertyId != Constants::NoProperty);
            PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
            if (propertyMap->TryGetReference(propertyRecord, &descriptor))
            {
                if (descriptor->Attributes & (PropertyDeleted | (!allowLetConstGlobal ? PropertyLetConstGlobal : 0)))
                {
                    // If PropertyLetConstGlobal is present then we have a let/const and no global property,
                    // since SimpleDictionaryTypeHandler does not support shadowing which means it can only
                    // have one or the other.  Therefore return true for no property found if allowLetConstGlobal
                    // is false.  If allowLetConstGlobal is true we will enter the else if branch below and
                    // return false since let/const variables cannot be deleted.
                    return true;
                }
                else if (!(descriptor->Attributes & PropertyConfigurable) ||
                    (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal)))
                {
                    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                        propertyOperationFlags, scriptContext, propertyRecord->GetBuffer());

                    return false;
                }
                Assert(!(descriptor->Attributes & PropertyLetConstGlobal));
                Var undefined = scriptContext->GetLibrary()->GetUndefined();
                if (descriptor->propertyIndex != NoSlots)
                {
                    if (SupportsSwitchingToUnordered(scriptContext))
                    {
                        ++numDeletedProperties;
                        if (numDeletedProperties >= CONFIG_FLAG(DeletedPropertyReuseThreshold))
                        {
                            // This type handler is being used as a hashtable. Start reusing deleted property indexes for new
                            // property IDs. After this, enumeration order is nondeterministic.
                            // Also use JavascriptString* as the property map key so that PropertyRecords can be avoided
                            // entirely where possible.

                            // Check if prototype chain has enumerable properties, according to logic used in
                            // ForInObjectEnumerator::Initialize().  If there are enumerable properties in the
                            // prototype chain, then enumerating this object's properties will require keeping
                            // track of properties so that shadowed properties are not included, but doing so
                            // currently requires converting the property to a PropertyRecord with a PropertyId
                            // for use in a bit vector that tracks shadowing.  To avoid having a string keyed
                            // type handler hit this, only convert to the string keyed type handler if the
                            // prototype chain does not have enumerable properties.
                            bool fConvertToStringKeyedHandler =
                                !hasNamelessPropertyId &&
                                ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties(instance) == nullptr;

                            if (fConvertToStringKeyedHandler)
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                // if TMapKey is already JavascriptString* we will not get here because we'd
                                // already be unordered and SupportsSwitchingToUnordered would have returned false
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
                            }
                            else
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
                            }
                        }
                    }

#if ENABLE_FIXED_FIELDS
                    Assert(this->singletonInstance == nullptr || instance == this->singletonInstance->Get());
                    InvalidateFixedField(propertyRecord, descriptor, instance->GetScriptContext());
#endif

                    if (this->GetFlags() & IsPrototypeFlag)
                    {
                        scriptContext->InvalidateProtoCaches(propertyId);
                    }

                    // If this is an unordered type handler, register the deleted property index so that it can be reused for
                    // other property IDs added later
                    if(!isUnordered ||
                        !AsUnordered()->TryRegisterDeletedPropertyIndex(instance, descriptor->propertyIndex))
                    {
                        SetSlotUnchecked(instance, descriptor->propertyIndex, undefined);
                    }
                }
                descriptor->Attributes = PropertyDeletedDefaults;

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);
                return true;
            }

            // Check for a numeric propertyRecord only if objectArray available
            if (instance->HasObjectArray() && propertyRecord->IsNumeric())
            {
                return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteItem(instance, propertyRecord->GetNumericValue(), propertyOperationFlags);
            }
        }
        else
        {
            SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported> *simpleBase = ConvertToNonSharedSimpleDictionaryType(instance);
            return simpleBase->DeleteProperty_Internal<allowLetConstGlobal>(instance, propertyId, propertyOperationFlags);
        }
        return true;
    }